

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PresolveComponent.cpp
# Opt level: O1

HighsPresolveStatus __thiscall PresolveComponent::run(PresolveComponent *this)

{
  bool bVar1;
  HighsPresolveStatus HVar2;
  HPresolve presolve;
  HPresolve local_6e0;
  
  local_6e0.mipsolver = (HighsMipSolver *)0x0;
  memset(&local_6e0.impliedDualRowBounds,0,0xc0);
  memset(&local_6e0.Avalue,0,0x348);
  local_6e0.changedRowIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e0.changedRowIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6e0.changedRowIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e0.changedRowFlag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e0.changedRowFlag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6e0.changedRowFlag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e0.changedColIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e0.changedColIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6e0.changedColIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e0.changedColFlag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e0.changedColFlag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6e0.changedColFlag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e0.substitutionOpportunities.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e0.substitutionOpportunities.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6e0.substitutionOpportunities.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e0.liftingOpportunities._M_h._M_bucket_count = 1;
  local_6e0.liftingOpportunities._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_6e0.liftingOpportunities._M_h._M_element_count = 0;
  local_6e0.liftingOpportunities._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_6e0.liftingOpportunities._M_h._M_rehash_policy._M_next_resize = 0;
  local_6e0.liftingOpportunities._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_6e0.equations._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_6e0.equations._M_t._M_impl.super__Rb_tree_header._M_header;
  local_6e0.equations._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_6e0.equations._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_6e0.analysis_.allow_rule_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_6e0.analysis_.allow_rule_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  local_6e0.analysis_.allow_rule_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_6e0.analysis_.allow_rule_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  local_6e0.analysis_.allow_rule_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  local_6e0.analysis_.presolve_log_.rule.
  super__Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e0.analysis_.presolve_log_.rule.
  super__Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e0.analysis_.presolve_log_.rule.
  super__Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6e0.eqiters.
  super__Vector_base<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6e0.eqiters.
  super__Vector_base<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e0.equations._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_6e0.eqiters.
  super__Vector_base<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e0.numProbes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e0.numProbes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e0.numProbes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6e0.colDeleted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6e0.colDeleted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e0.rowDeleted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e0.colDeleted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e0.rowDeleted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e0.rowDeleted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6e0.singletonColumns.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6e0.singletonColumns.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e0.singletonRows.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e0.singletonColumns.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e0.singletonRows.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e0.singletonRows.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6e0.liftingOpportunities._M_h._M_buckets =
       &local_6e0.liftingOpportunities._M_h._M_single_bucket;
  local_6e0.equations._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_6e0.equations._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar1 = ::presolve::HPresolve::okSetInput
                    (&local_6e0,&(this->data_).reduced_lp_,this->options_,
                     (this->options_->super_HighsOptionsStruct).presolve_reduction_limit,this->timer
                    );
  HVar2 = kOutOfMemory;
  if (bVar1) {
    ::presolve::HPresolve::run(&local_6e0,&(this->data_).postSolveStack);
    std::vector<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>::operator=
              (&(this->data_).presolve_log_.rule,&local_6e0.analysis_.presolve_log_.rule);
    HVar2 = local_6e0.presolve_status_;
  }
  this->presolve_status_ = HVar2;
  ::presolve::HPresolve::~HPresolve(&local_6e0);
  return HVar2;
}

Assistant:

HighsPresolveStatus PresolveComponent::run() {
  presolve::HPresolve presolve;
  if (!presolve.okSetInput(data_.reduced_lp_, *options_,
                           options_->presolve_reduction_limit, timer)) {
    presolve_status_ = HighsPresolveStatus::kOutOfMemory;
    return presolve_status_;
  }

  presolve.run(data_.postSolveStack);
  data_.presolve_log_ = presolve.getPresolveLog();
  presolve_status_ = presolve.getPresolveStatus();
  return presolve_status_;
}